

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QByteArray,QByteArray>>::
emplace<std::pair<QByteArray,QByteArray>>
          (QMovableArrayOps<std::pair<QByteArray,QByteArray>> *this,qsizetype i,
          pair<QByteArray,_QByteArray> *args)

{
  undefined8 *puVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  Data *pDVar5;
  char *pcVar6;
  qsizetype qVar7;
  Data *pDVar8;
  char *pcVar9;
  qsizetype qVar10;
  long lVar11;
  
  piVar2 = *(int **)this;
  if ((piVar2 != (int *)0x0) && (*piVar2 < 2)) {
    if ((*(long *)(this + 0x10) == i) &&
       (lVar3 = *(long *)(this + 8),
       *(long *)(piVar2 + 2) - i !=
       ((long)(lVar3 - ((long)piVar2 + 0x1fU & 0xfffffffffffffff0)) >> 4) * -0x5555555555555555)) {
      lVar11 = i * 0x30;
      pDVar5 = (args->first).d.d;
      (args->first).d.d = (Data *)0x0;
      *(Data **)(lVar3 + lVar11) = pDVar5;
      pcVar6 = (args->first).d.ptr;
      (args->first).d.ptr = (char *)0x0;
      *(char **)(lVar3 + 8 + lVar11) = pcVar6;
      qVar7 = (args->first).d.size;
      (args->first).d.size = 0;
      *(qsizetype *)(lVar3 + 0x10 + lVar11) = qVar7;
      pDVar5 = (args->second).d.d;
      (args->second).d.d = (Data *)0x0;
      *(Data **)(lVar3 + 0x18 + lVar11) = pDVar5;
      pcVar6 = (args->second).d.ptr;
      (args->second).d.ptr = (char *)0x0;
      *(char **)(lVar3 + 0x20 + lVar11) = pcVar6;
      qVar7 = (args->second).d.size;
      (args->second).d.size = 0;
      *(qsizetype *)(lVar3 + 0x28 + lVar11) = qVar7;
      goto LAB_001926dc;
    }
    if ((i == 0) &&
       (uVar4 = *(ulong *)(this + 8), ((long)piVar2 + 0x1fU & 0xfffffffffffffff0) != uVar4)) {
      pDVar5 = (args->first).d.d;
      (args->first).d.d = (Data *)0x0;
      *(Data **)(uVar4 - 0x30) = pDVar5;
      pcVar6 = (args->first).d.ptr;
      (args->first).d.ptr = (char *)0x0;
      *(char **)(uVar4 - 0x28) = pcVar6;
      qVar7 = (args->first).d.size;
      (args->first).d.size = 0;
      *(qsizetype *)(uVar4 - 0x20) = qVar7;
      pDVar5 = (args->second).d.d;
      (args->second).d.d = (Data *)0x0;
      *(Data **)(uVar4 - 0x18) = pDVar5;
      pcVar6 = (args->second).d.ptr;
      (args->second).d.ptr = (char *)0x0;
      *(char **)(uVar4 - 0x10) = pcVar6;
      qVar7 = (args->second).d.size;
      (args->second).d.size = 0;
      *(qsizetype *)(uVar4 - 8) = qVar7;
      *(long *)(this + 8) = *(long *)(this + 8) + -0x30;
      goto LAB_001926dc;
    }
  }
  pDVar5 = (args->first).d.d;
  pcVar6 = (args->first).d.ptr;
  (args->first).d.d = (Data *)0x0;
  (args->first).d.ptr = (char *)0x0;
  qVar7 = (args->first).d.size;
  pDVar8 = (args->second).d.d;
  (args->first).d.size = 0;
  (args->second).d.d = (Data *)0x0;
  pcVar9 = (args->second).d.ptr;
  qVar10 = (args->second).d.size;
  (args->second).d.ptr = (char *)0x0;
  (args->second).d.size = 0;
  lVar3 = *(long *)(this + 0x10);
  QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)this,
             (uint)(i == 0 && lVar3 != 0),1,(pair<QByteArray,_QByteArray> **)0x0,
             (QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)0x0);
  lVar11 = *(long *)(this + 8);
  if (i == 0 && lVar3 != 0) {
    *(Data **)(lVar11 + -0x30) = pDVar5;
    *(char **)(lVar11 + -0x28) = pcVar6;
    *(qsizetype *)(lVar11 + -0x20) = qVar7;
    *(Data **)(lVar11 + -0x18) = pDVar8;
    *(char **)(lVar11 + -0x10) = pcVar9;
    *(qsizetype *)(lVar11 + -8) = qVar10;
    *(long *)(this + 8) = lVar11 + -0x30;
  }
  else {
    puVar1 = (undefined8 *)(lVar11 + i * 0x30);
    memmove(puVar1 + 6,(void *)(lVar11 + i * 0x30),(*(long *)(this + 0x10) - i) * 0x30);
    *puVar1 = pDVar5;
    puVar1[1] = pcVar6;
    puVar1[2] = qVar7;
    puVar1[3] = pDVar8;
    puVar1[4] = pcVar9;
    puVar1[5] = qVar10;
  }
LAB_001926dc:
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }